

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>::Divide
          (TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *this,TPZVec<TPZGeoEl_*> *SubElVec)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  TPZAutoPointer *this_00;
  ostream *this_01;
  TPZRefPattern *this_02;
  TPZGeoEl *pTVar6;
  TPZGeoEl **ppTVar7;
  _func_int **pp_Var8;
  int64_t index_00;
  long *plVar9;
  undefined8 uVar10;
  TPZGeoEl *pTVar11;
  TPZGeoEl *pTVar12;
  TPZVec<TPZGeoEl_*> *in_RSI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide gs;
  TPZGeoElSide neighbour;
  TPZGeoElSide refneigh;
  TPZGeoElSide thisside;
  TPZGeoEl *refsubel;
  TPZGeoEl *subel;
  int64_t cornerid;
  TPZManVector<long,_30> cornerindexes;
  int subcorner;
  int nnodes;
  TPZManVector<long,_30> np;
  int64_t totalnodes;
  int matid;
  int sub;
  int k;
  int j;
  int64_t index;
  int NSubEl;
  int i;
  iterator it;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> compat;
  TPZAutoPointer<TPZRefPattern> uniform;
  MElementType typeel;
  MElementType in_stack_0000179c;
  TPZRefPatternDataBase *in_stack_000017a0;
  TPZGeoEl *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  uint in_stack_fffffffffffffa84;
  TPZGeoEl *in_stack_fffffffffffffa88;
  TPZVec<long> *in_stack_fffffffffffffa90;
  TPZGeoEl *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  int64_t in_stack_fffffffffffffaa8;
  TPZManVector<long,_30> *in_stack_fffffffffffffab0;
  bool local_541;
  uint uVar13;
  undefined8 in_stack_fffffffffffffb20;
  MElementType type;
  TPZRefPatternDataBase *in_stack_fffffffffffffb28;
  long lVar14;
  TPZGeoElSide *in_stack_fffffffffffffb78;
  TPZGeoElSide *in_stack_fffffffffffffb80;
  TPZGeoEl local_3e8;
  TPZAutoPointer<TPZRefPattern> local_370;
  TPZGeoElSide local_368;
  TPZGeoElSide local_350;
  TPZAutoPointer<TPZRefPattern> local_338;
  TPZGeoEl *local_330;
  TPZAutoPointer<TPZRefPattern> local_328;
  undefined8 local_320;
  TPZAutoPointer<TPZRefPattern> local_318;
  int64_t local_310;
  TPZVec<long> local_308 [8];
  TPZAutoPointer<TPZRefPattern> local_1f8;
  int local_1ec;
  TPZAutoPointer<TPZRefPattern> local_1e8;
  TPZAutoPointer<TPZRefPattern> local_1e0;
  int local_1d4;
  undefined8 local_1d0;
  TPZVec<long> local_1c8 [2];
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  *in_stack_fffffffffffffe78;
  TPZGeoEl *in_stack_fffffffffffffe80;
  TPZAutoPointer<TPZRefPattern> local_b8;
  long local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  undefined1 local_98 [8];
  TPZAutoPointer<TPZRefPattern> local_90;
  int local_84;
  int local_80;
  uint local_7c;
  undefined1 local_78 [8];
  _Self local_70;
  _List_node_base *local_68;
  _Self local_60;
  _Self local_58 [4];
  TPZAutoPointer local_38 [24];
  TPZAutoPointer local_20 [12];
  int local_14;
  TPZVec<TPZGeoEl_*> *local_10;
  
  type = (MElementType)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  local_10 = in_RSI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&in_RDI[10].fReference);
  if (!bVar1) {
    local_14 = (**(code **)(*(long *)in_RDI + 0xb8))();
    if (local_14 == 0) {
      return;
    }
    TPZRefPatternDataBase::GetUniformRefPattern(in_stack_fffffffffffffb28,type);
    bVar1 = ::TPZAutoPointer::operator_cast_to_bool(local_20);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      TPZRefPatternDataBase::InitializeUniformRefPattern(in_stack_000017a0,in_stack_0000179c);
    }
    TPZRefPatternDataBase::GetUniformRefPattern(in_stack_fffffffffffffb28,type);
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x172db50);
    TPZRefPatternTools::GetCompatibleRefPatterns
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_58[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::begin
                   ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)in_stack_fffffffffffffa78);
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::end
                     ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                       *)in_stack_fffffffffffffa78);
      bVar1 = std::operator!=(local_58,&local_60);
      if (!bVar1) break;
      this_00 = (TPZAutoPointer *)
                std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                          ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x172dbbc);
      bVar1 = ::TPZAutoPointer::operator_cast_to_bool(this_00);
      bVar2 = ::TPZAutoPointer::operator_cast_to_bool(local_38);
      if (bVar1 == bVar2) break;
      local_68 = (_List_node_base *)
                 std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator++(local_58,0);
    }
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::end
                   ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)in_stack_fffffffffffffa78);
    bVar1 = std::operator!=(local_58,&local_70);
    if (bVar1) {
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffa78);
      (**(code **)(*(long *)in_RDI + 0x2a8))(in_RDI,local_78);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    }
    else {
      this_01 = std::operator<<((ostream *)&std::cerr,
                                "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!"
                               );
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      (*local_10->_vptr_TPZVec[3])(local_10,0);
    }
    local_7c = (uint)!bVar1;
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::~list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x172dd4f);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    if (local_7c != 0) {
      return;
    }
  }
  (**(code **)(*(long *)in_RDI + 0x2b0))();
  this_02 = TPZAutoPointer<TPZRefPattern>::operator->(&local_90);
  iVar3 = TPZRefPattern::NSubElements(this_02);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  local_84 = iVar3;
  iVar3 = (**(code **)(*(long *)in_RDI + 0x1d0))();
  if (iVar3 == 0) {
    local_a8 = TPZGeoEl::MaterialId(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x2b0))();
    TPZAutoPointer<TPZRefPattern>::operator->(&local_b8);
    iVar3 = TPZRefPattern::NNodes((TPZRefPattern *)0x172df20);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    local_1d0 = 0;
    local_b0 = (long)iVar3;
    TPZManVector<long,_30>::TPZManVector
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
               (long *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    local_1d4 = (**(code **)(*(long *)in_RDI + 0x98))();
    for (local_9c = 0; (int)local_9c < local_1d4; local_9c = local_9c + 1) {
      pp_Var8 = (_func_int **)(**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_9c);
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_1e0);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_1e0);
      pTVar6 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      in_stack_fffffffffffffb80 =
           (TPZGeoElSide *)(**(code **)(*(long *)pTVar6 + 0xa8))(pTVar6,local_9c);
      in_stack_fffffffffffffb78 =
           (TPZGeoElSide *)TPZVec<long>::operator[](local_1c8,(int64_t)in_stack_fffffffffffffb80);
      (in_stack_fffffffffffffb78->super_TPZSavable)._vptr_TPZSavable = pp_Var8;
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    }
    (**(code **)(*(long *)in_RDI + 0x2b0))(&local_1e8);
    TPZAutoPointer<TPZRefPattern>::operator->(&local_1e8);
    TPZRefPattern::CreateNewNodes
              ((TPZRefPattern *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    for (local_80 = 0; local_80 < local_84; local_80 = local_80 + 1) {
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_1f8);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_1f8);
      pTVar6 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      iVar3 = (**(code **)(*(long *)pTVar6 + 0x98))();
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      local_1ec = iVar3;
      TPZManVector<long,_30>::TPZManVector
                ((TPZManVector<long,_30> *)
                 CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (int64_t)in_stack_fffffffffffffa98);
      for (local_9c = 0; (int)local_9c < local_1ec; local_9c = local_9c + 1) {
        (**(code **)(*(long *)in_RDI + 0x2b0))(&local_318);
        TPZAutoPointer<TPZRefPattern>::operator->(&local_318);
        pTVar6 = TPZRefPattern::Element
                           ((TPZRefPattern *)
                            CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                            (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        index_00 = (**(code **)(*(long *)pTVar6 + 0xa8))(pTVar6,local_9c);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
        local_310 = index_00;
        plVar9 = TPZVec<long>::operator[](local_1c8,index_00);
        lVar14 = *plVar9;
        plVar9 = TPZVec<long>::operator[](local_308,(long)(int)local_9c);
        *plVar9 = lVar14;
      }
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_328);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_328);
      pTVar6 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      uVar4 = (**(code **)(*(long *)pTVar6 + 0xb8))();
      uVar10 = (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,uVar4,local_308,local_a8,local_98);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      local_320 = uVar10;
      (**(code **)(*(long *)in_RDI + 0x1b0))(in_RDI,local_80,uVar10);
      TPZManVector<long,_30>::~TPZManVector
                ((TPZManVector<long,_30> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    }
    (*local_10->_vptr_TPZVec[3])(local_10,(long)local_84);
    for (local_a4 = 0; local_a4 < local_84; local_a4 = local_a4 + 1) {
      pTVar6 = (TPZGeoEl *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_a4);
      ppTVar7 = TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_a4);
      *ppTVar7 = pTVar6;
      TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_a4);
      TPZGeoEl::SetFather((TPZGeoEl *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          in_stack_fffffffffffffa78);
      ppTVar7 = TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_a4);
      (**(code **)(*(long *)*ppTVar7 + 0x1f0))(*ppTVar7,in_RDI->fIndex);
    }
    for (local_80 = 0; local_80 < local_84; local_80 = local_80 + 1) {
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_338);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_338);
      pTVar6 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      local_9c = 0;
      local_330 = pTVar6;
      while (uVar13 = local_9c, iVar3 = (**(code **)(*(long *)local_330 + 0xf0))(),
            (int)uVar13 < iVar3) {
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                   in_stack_fffffffffffffa84);
        (**(code **)(*(long *)local_330 + 0x188))(&local_368,local_330,local_9c);
        iVar5 = TPZGeoElSide::Exists(&local_368);
        if ((iVar5 == 0) || (iVar5 = TPZGeoElSide::operator!=(&local_368,&local_350), iVar5 == 0)) {
          in_stack_fffffffffffffa90 =
               (TPZVec<long> *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
          in_stack_fffffffffffffa84 = local_9c;
          in_stack_fffffffffffffa88 =
               (TPZGeoEl *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
          in_stack_fffffffffffffa78 = &local_3e8;
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                     in_stack_fffffffffffffa84);
          (*in_stack_fffffffffffffa90->_vptr_TPZVec[0x33])
                    (in_stack_fffffffffffffa90,(ulong)in_stack_fffffffffffffa84,
                     in_stack_fffffffffffffa78);
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172eb5d);
        }
        else {
          for (local_a0 = 0; local_a0 < local_84 + 1; local_a0 = local_a0 + 1) {
            (**(code **)(*(long *)in_RDI + 0x2b0))(&local_370);
            TPZAutoPointer<TPZRefPattern>::operator->(&local_370);
            pTVar11 = TPZRefPattern::Element
                                ((TPZRefPattern *)
                                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20));
            pTVar12 = TPZGeoElSide::Element(&local_368);
            local_541 = pTVar11 == pTVar12 && local_a0 + -1 != local_80;
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZRefPattern> *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
            if (local_541) {
              TPZGeoElSide::TPZGeoElSide
                        ((TPZGeoElSide *)
                         CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
              if (local_a0 == 0) {
                TPZGeoElSide::Side(&local_368);
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                           in_stack_fffffffffffffa84);
                TPZGeoElSide::operator=
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           (TPZGeoElSide *)in_stack_fffffffffffffa78);
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172e9bf);
              }
              else {
                (**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_a0 + -1);
                TPZGeoElSide::Side(&local_368);
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                           in_stack_fffffffffffffa84);
                TPZGeoElSide::operator=
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           (TPZGeoElSide *)in_stack_fffffffffffffa78);
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172e8dd);
              }
              (**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
              TPZGeoElSide::TPZGeoElSide
                        ((TPZGeoElSide *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                         in_stack_fffffffffffffa84);
              iVar3 = TPZGeoElSide::NeighbourExists
                                ((TPZGeoElSide *)pTVar6,(TPZGeoElSide *)CONCAT44(iVar3,uVar13));
              if (iVar3 == 0) {
                TPZGeoElSide::SetConnectivity(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
              }
              local_7c = 0x19;
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172ea74);
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172ea81);
              break;
            }
          }
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172eb8f);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x172eb9c);
        local_9c = local_9c + 1;
      }
    }
    (**(code **)(*(long *)in_RDI + 0x1b8))();
    TPZManVector<long,_30>::~TPZManVector
              ((TPZManVector<long,_30> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  }
  else {
    (*local_10->_vptr_TPZVec[3])(local_10,(long)local_84);
    for (local_80 = 0; local_80 < local_84; local_80 = local_80 + 1) {
      pTVar6 = (TPZGeoEl *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
      ppTVar7 = TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_80);
      *ppTVar7 = pTVar6;
    }
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Divide(TPZVec<TPZGeoEl *> &SubElVec){
	if (!fRefPattern) {
		MElementType typeel = this->Type();
		if(typeel == EPoint)
			return;
		if(!gRefDBase.GetUniformRefPattern(typeel))
		{
			gRefDBase.InitializeUniformRefPattern(typeel);
		}
		TPZAutoPointer<TPZRefPattern> uniform = gRefDBase.GetUniformRefPattern(typeel);
		std::list<TPZAutoPointer<TPZRefPattern> > compat;
		TPZRefPatternTools::GetCompatibleRefPatterns(this,compat);
		std::list<TPZAutoPointer<TPZRefPattern> >::iterator it = compat.begin();
		while(it != compat.end()){
			if(*it == uniform) break;
			it++;
		}
		if(it != compat.end())
		{
			this->SetRefPattern(uniform);
		}
		else
		{
			PZError << "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!" << std::endl;
			SubElVec.Resize(0);
			return;
		}
	}
	int i;
	int NSubEl = this->GetRefPattern()->NSubElements();
	if(HasSubElement()) {
		SubElVec.Resize(NSubEl);
		for(i=0;i<NSubEl;i++) SubElVec[i] = SubElement(i);
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if(loggerrefpattern.isWarnEnabled())
		{
			std::stringstream sout;
			sout << "Trying to divide element which has subelements " << this->Index() << std::endl;
			sout << "Subelement indices ";
			for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
			LOGPZ_WARN(loggerrefpattern,sout.str());
		}
#endif
		return;//If exist fSubEl return this sons
	}
	int64_t index;
	int j, k, sub, matid=this->MaterialId();
	
	int64_t totalnodes = this->GetRefPattern()->NNodes();
	TPZManVector<int64_t,30> np(totalnodes,0);
	int nnodes = this->NCornerNodes();
	
	for(j=0;j<nnodes;j++) {
		np[this->GetRefPattern()->Element(0)->NodeIndex(j)] = this->NodeIndex(j);
	}
	this->GetRefPattern()->CreateNewNodes (this, np);
	//std::cout << "NewNodeIndexes : " << np << std::endl;
	
	// creating new subelements
	for(i=0;i<NSubEl;i++) {
		int subcorner = this->GetRefPattern()->Element(i+1)->NCornerNodes();
		TPZManVector<int64_t,30> cornerindexes(subcorner);
		for(j=0;j<subcorner;j++) {
			int64_t cornerid = this->GetRefPattern()->Element(i+1)->NodeIndex(j);
			cornerindexes[j] = np[cornerid];
		}
		//std::cout << "Subel corner " << cornerindexes << std::endl;
		TPZGeoEl *subel = this->CreateGeoElement((MElementType)this->GetRefPattern()->Element(i+1)->Type(),cornerindexes,matid,index);
		SetSubElement(i,subel);
	}
	
	SubElVec.Resize(NSubEl);
	for(sub=0;sub<NSubEl;sub++) {
		SubElVec[sub] = SubElement(sub);
		SubElVec[sub]->SetFather(this);
		SubElVec[sub]->SetFatherIndex(this->fIndex);
	}

	for(i=0;i<NSubEl;i++) {
		//std::cout << "SubElement " << i << std::endl;
		TPZGeoEl *refsubel = this->GetRefPattern()->Element(i+1);
		for (j=0;j<refsubel->NSides();j++){
			//std::cout << "\t Side " << j << std::endl;
			TPZGeoElSide thisside (refsubel,j);
			TPZGeoElSide refneigh = refsubel->Neighbour(j);
			if(refneigh.Exists() && refneigh != thisside) {
				//como nao me deixam guardar o index do elemento geometrico...
				for (k=0;k<NSubEl+1;k++){
					if (this->GetRefPattern()->Element(k) == refneigh.Element() && k-1 != i){
						//    std::cout << "\t\t\tFound subel " << k << "  side of subel " << refneigh.Side()
						//      << "For subelement " << i << " side " << j << std::endl;
						TPZGeoElSide neighbour;
						if(k) {
							neighbour = TPZGeoElSide(SubElement(k-1),refneigh.Side());
						} else {
							neighbour = TPZGeoElSide(this, refneigh.Side());
						}
						TPZGeoElSide gs(SubElement(i),j);
						if(!gs.NeighbourExists(neighbour)) gs.SetConnectivity(neighbour);
						break;
					}
				}
				if(k == NSubEl+1) {
					//std::cout << "TPZGeoElRefPattern<TGeo>::Divide inconsistent datastructure subelement "
					//  << i << " Side " << j << std::endl;
				}
			} else {
				SubElement(i)->SetNeighbour(j,TPZGeoElSide(SubElement(i),j));
			}
		}
	}
	
	this->SetSubElementConnectivities();
#ifdef PZ_LOG
    {
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if (loggerrefpattern.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Dividing element " << this->Index() << std::endl;
            sout << "Subelement indices ";
            for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
            LOGPZ_DEBUG(loggerrefpattern,sout.str())
        }
    }
#endif
}